

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::phase1ChooseRow(HEkkPrimal *this)

{
  pair<double,_int> *ppVar1;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *this_00;
  pointer *pppVar2;
  HEkk *pHVar3;
  pointer ppVar4;
  iterator iVar5;
  pointer ppVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  HighsInt HVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  pair<double,_int> local_88;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pHVar3 = this->ekk_instance_;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x27,0);
  iVar11 = (pHVar3->info_).update_count;
  if (iVar11 < 10) {
    local_58 = 1e-09;
  }
  else {
    local_58 = *(double *)(&DAT_003dd050 + (ulong)(iVar11 < 0x14) * 8);
  }
  uStack_50 = 0;
  ppVar4 = (this->ph1SorterR).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ph1SorterR).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar4) {
    (this->ph1SorterR).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar4;
  }
  ppVar4 = (this->ph1SorterT).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ph1SorterT).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar4) {
    (this->ph1SorterT).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar4;
  }
  if (0 < (this->col_aq).count) {
    local_60 = (vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
               &this->ph1SorterR;
    this_00 = &this->ph1SorterT;
    local_48 = -local_58;
    uStack_40 = 0x8000000000000000;
    lVar12 = 0;
    do {
      iVar11 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      dVar19 = (double)this->move_in *
               (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar11];
      if (local_58 < dVar19) {
        dVar17 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar11];
        dVar18 = (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar11];
        if (dVar18 + this->primal_feasibility_tolerance < dVar17) {
          local_88.first = ((dVar17 - dVar18) - this->primal_feasibility_tolerance) / dVar19;
          iVar5._M_current =
               (this->ph1SorterR).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->ph1SorterR).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_88.second = iVar11;
            local_78 = dVar19;
            local_68 = local_88.first;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>(local_60,iVar5,&local_88);
            local_88.first = local_68;
            dVar19 = local_78;
          }
          else {
            (iVar5._M_current)->first = local_88.first;
            *(ulong *)&(iVar5._M_current)->second = CONCAT44(local_88._12_4_,iVar11);
            pppVar2 = &(this->ph1SorterR).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
          }
          iVar5._M_current =
               (this->ph1SorterT).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->ph1SorterT).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_88.second = iVar11;
            local_78 = dVar19;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>
                      ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                       this_00,iVar5,&local_88);
            dVar19 = local_78;
          }
          else {
            (iVar5._M_current)->first = local_88.first;
            *(ulong *)&(iVar5._M_current)->second = CONCAT44(local_88._12_4_,iVar11);
            pppVar2 = &(this->ph1SorterT).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
            local_88.second = iVar11;
          }
        }
        dVar17 = (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar11];
        if (dVar17 != -INFINITY) {
          dVar18 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar11];
          if (dVar17 - this->primal_feasibility_tolerance < dVar18) {
            dVar18 = dVar18 - dVar17;
            local_88.first = (this->primal_feasibility_tolerance + dVar18) / dVar19;
            local_88.second = iVar11 - this->num_row;
            iVar5._M_current =
                 (this->ph1SorterR).
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->ph1SorterR).
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_78 = dVar19;
              local_68 = dVar18;
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>(local_60,iVar5,&local_88);
              dVar18 = local_68;
              dVar19 = local_78;
            }
            else {
              (iVar5._M_current)->first = local_88.first;
              *(ulong *)&(iVar5._M_current)->second = CONCAT44(local_88._12_4_,local_88.second);
              pppVar2 = &(this->ph1SorterR).
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar2 = *pppVar2 + 1;
            }
            local_88.first = dVar18 / dVar19;
            local_88.second = iVar11 - this->num_row;
            iVar5._M_current =
                 (this->ph1SorterT).
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->ph1SorterT).
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_78 = dVar19;
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>
                        ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                         this_00,iVar5,&local_88);
              dVar19 = local_78;
            }
            else {
              (iVar5._M_current)->first = local_88.first;
              *(ulong *)&(iVar5._M_current)->second = CONCAT44(local_88._12_4_,local_88.second);
              pppVar2 = &(this->ph1SorterT).
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar2 = *pppVar2 + 1;
            }
          }
        }
      }
      if (dVar19 < local_48) {
        dVar17 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar11];
        dVar18 = (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar11];
        if (dVar17 < dVar18 - this->primal_feasibility_tolerance) {
          local_88.first = ((dVar17 - dVar18) + this->primal_feasibility_tolerance) / dVar19;
          local_88.second = iVar11 - this->num_row;
          iVar5._M_current =
               (this->ph1SorterR).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->ph1SorterR).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_78 = dVar19;
            local_68 = local_88.first;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>(local_60,iVar5,&local_88);
            local_88.first = local_68;
            dVar19 = local_78;
          }
          else {
            (iVar5._M_current)->first = local_88.first;
            *(ulong *)&(iVar5._M_current)->second = CONCAT44(local_88._12_4_,local_88.second);
            pppVar2 = &(this->ph1SorterR).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
          }
          local_88.second = iVar11 - this->num_row;
          iVar5._M_current =
               (this->ph1SorterT).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->ph1SorterT).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_78 = dVar19;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>
                      ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                       this_00,iVar5,&local_88);
            dVar19 = local_78;
          }
          else {
            (iVar5._M_current)->first = local_88.first;
            *(ulong *)&(iVar5._M_current)->second = CONCAT44(local_88._12_4_,local_88.second);
            pppVar2 = &(this->ph1SorterT).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
          }
        }
        dVar17 = (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar11];
        if (dVar17 != INFINITY) {
          dVar18 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar11];
          if (dVar18 < dVar17 + this->primal_feasibility_tolerance) {
            dVar18 = dVar18 - dVar17;
            local_88.first = (dVar18 - this->primal_feasibility_tolerance) / dVar19;
            iVar5._M_current =
                 (this->ph1SorterR).
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->ph1SorterR).
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_88.second = iVar11;
              local_78 = dVar19;
              local_68 = dVar18;
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>(local_60,iVar5,&local_88);
              dVar18 = local_68;
              dVar19 = local_78;
            }
            else {
              (iVar5._M_current)->first = local_88.first;
              *(ulong *)&(iVar5._M_current)->second = CONCAT44(local_88._12_4_,iVar11);
              pppVar2 = &(this->ph1SorterR).
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar2 = *pppVar2 + 1;
            }
            local_88.first = dVar18 / dVar19;
            iVar5._M_current =
                 (this->ph1SorterT).
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->ph1SorterT).
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_88.second = iVar11;
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>
                        ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                         this_00,iVar5,&local_88);
            }
            else {
              (iVar5._M_current)->first = local_88.first;
              *(ulong *)&(iVar5._M_current)->second = CONCAT44(local_88._12_4_,iVar11);
              pppVar2 = &(this->ph1SorterT).
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar2 = *pppVar2 + 1;
              local_88.second = iVar11;
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->col_aq).count);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x27,0);
  if ((this->ph1SorterR).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->ph1SorterR).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this->row_out = -1;
    this->variable_out = -1;
  }
  else {
    iVar11 = 0;
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x28,0);
    ppVar4 = (this->ph1SorterR).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (this->ph1SorterR).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar4 != ppVar6) {
      uVar9 = (long)ppVar6 - (long)ppVar4 >> 4;
      if (1 < uVar9) {
        iVar11 = 0;
        do {
          uVar9 = (long)uVar9 >> 1;
          iVar11 = iVar11 + 1;
        } while (1 < uVar9);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
                (ppVar4,ppVar6,iVar11,1);
    }
    ppVar4 = (this->ph1SorterR).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar19 = ppVar4->first;
    lVar12 = (long)(this->ph1SorterR).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4;
    if (lVar12 != 0) {
      lVar12 = lVar12 >> 4;
      dVar17 = ABS(this->theta_dual);
      lVar12 = lVar12 + -1 + (ulong)(lVar12 == 0);
      piVar10 = &ppVar4->second;
      do {
        dVar17 = dVar17 - ABS((this->col_aq).array.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [(*piVar10 >> 0x1f & this->num_row) + *piVar10]);
        bVar15 = lVar12 != 0;
        lVar12 = lVar12 + -1;
        dVar19 = (double)((ulong)dVar19 & -(ulong)(dVar17 <= 0.0) |
                         ~-(ulong)(dVar17 <= 0.0) &
                         (ulong)((pair<double,_int> *)(piVar10 + -2))->first);
        if (dVar17 <= 0.0) break;
        piVar10 = piVar10 + 4;
      } while (bVar15);
    }
    ppVar4 = (this->ph1SorterT).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (this->ph1SorterT).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar4 != ppVar6) {
      uStack_70 = 0;
      uVar9 = (long)ppVar6 - (long)ppVar4 >> 4;
      iVar11 = 0;
      if (1 < uVar9) {
        iVar11 = 0;
        do {
          uVar9 = (long)uVar9 >> 1;
          iVar11 = iVar11 + 1;
        } while (1 < uVar9);
      }
      local_78 = dVar19;
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
                (ppVar4,ppVar6,iVar11,1);
      dVar19 = local_78;
    }
    ppVar4 = (this->ph1SorterT).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (this->ph1SorterT).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    lVar12 = (long)ppVar6 - (long)ppVar4 >> 4;
    if (ppVar6 == ppVar4) {
      dVar17 = 0.0;
    }
    else {
      bVar15 = lVar12 == 0;
      lVar7 = lVar12 + -1;
      piVar10 = &ppVar4->second;
      lVar14 = 0;
      dVar18 = 0.0;
      do {
        ppVar1 = (pair<double,_int> *)(piVar10 + -2);
        iVar11 = *piVar10;
        piVar10 = piVar10 + 4;
        dVar17 = dVar18;
        lVar8 = lVar14;
        if ((ppVar1->first <= dVar19) &&
           (dVar17 = ABS((this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [(iVar11 >> 0x1f & this->num_row) + iVar11]), lVar8 = lVar12,
           dVar17 <= dVar18)) {
          dVar17 = dVar18;
        }
        lVar12 = lVar8;
      } while ((ppVar1->first <= dVar19) &&
              (bVar16 = lVar7 + (ulong)bVar15 != lVar14, lVar14 = lVar14 + 1, dVar18 = dVar17,
              bVar16));
      dVar17 = dVar17 * 0.1;
    }
    this->row_out = -1;
    this->variable_out = -1;
    this->move_out = 0;
    piVar10 = &ppVar4[lVar12 + -1].second;
    lVar12 = lVar12 + 1;
    do {
      lVar12 = lVar12 + -1;
      if (lVar12 == 0) goto LAB_00360ed5;
      iVar11 = *piVar10;
      piVar10 = piVar10 + -4;
      HVar13 = this->num_row;
      if (-1 < iVar11) {
        HVar13 = 0;
      }
    } while (ABS((this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[HVar13 + iVar11]) <= dVar17);
    this->row_out = HVar13 + iVar11;
    this->move_out = iVar11 >> 0x1f | 1;
LAB_00360ed5:
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x28,0);
  }
  return;
}

Assistant:

void HEkkPrimal::phase1ChooseRow() {
  const HighsSimplexInfo& info = ekk_instance_.info_;
  const vector<double>& baseLower = info.baseLower_;
  const vector<double>& baseUpper = info.baseUpper_;
  const vector<double>& baseValue = info.baseValue_;
  analysis->simplexTimerStart(Chuzr1Clock);
  // Collect phase 1 theta lists
  //

  const double dPivotTol = info.update_count < 10   ? 1e-9
                           : info.update_count < 20 ? 1e-8
                                                    : 1e-7;
  ph1SorterR.clear();
  ph1SorterT.clear();
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double dAlpha = col_aq.array[iRow] * move_in;

    // When the basic variable x[i] decrease
    if (dAlpha > +dPivotTol) {
      // Whether it can become feasible by going below its upper bound
      if (baseValue[iRow] > baseUpper[iRow] + primal_feasibility_tolerance) {
        double dFeasTheta =
            (baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance) /
            dAlpha;
        ph1SorterR.push_back(std::make_pair(dFeasTheta, iRow));
        ph1SorterT.push_back(std::make_pair(dFeasTheta, iRow));
      }
      // Whether it can become infeasible (again) by going below its
      // lower bound
      if (baseValue[iRow] > baseLower[iRow] - primal_feasibility_tolerance &&
          baseLower[iRow] > -kHighsInf) {
        double dRelaxTheta =
            (baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance) /
            dAlpha;
        double dTightTheta = (baseValue[iRow] - baseLower[iRow]) / dAlpha;
        ph1SorterR.push_back(std::make_pair(dRelaxTheta, iRow - num_row));
        ph1SorterT.push_back(std::make_pair(dTightTheta, iRow - num_row));
      }
    }

    // When the basic variable x[i] increase
    if (dAlpha < -dPivotTol) {
      // Whether it can become feasible by going above its lower bound
      if (baseValue[iRow] < baseLower[iRow] - primal_feasibility_tolerance) {
        double dFeasTheta =
            (baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance) /
            dAlpha;
        ph1SorterR.push_back(std::make_pair(dFeasTheta, iRow - num_row));
        ph1SorterT.push_back(std::make_pair(dFeasTheta, iRow - num_row));
      }
      // Whether it can become infeasible (again) by going above its
      // upper bound
      if (baseValue[iRow] < baseUpper[iRow] + primal_feasibility_tolerance &&
          baseUpper[iRow] < +kHighsInf) {
        double dRelaxTheta =
            (baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance) /
            dAlpha;
        double dTightTheta = (baseValue[iRow] - baseUpper[iRow]) / dAlpha;
        ph1SorterR.push_back(std::make_pair(dRelaxTheta, iRow));
        ph1SorterT.push_back(std::make_pair(dTightTheta, iRow));
      }
    }
  }

  analysis->simplexTimerStop(Chuzr1Clock);
  // When there are no candidates at all, we can leave it here
  if (ph1SorterR.empty()) {
    row_out = kNoRowChosen;
    variable_out = -1;
    return;
  }

  // Now sort the relaxed theta to find the final break point. TODO:
  // Consider partial sort. Or heapify [O(n)] and then pop k points
  // [kO(log(n))].

  analysis->simplexTimerStart(Chuzr2Clock);
  pdqsort(ph1SorterR.begin(), ph1SorterR.end());
  double dMaxTheta = ph1SorterR[0].first;
  double dGradient = fabs(theta_dual);
  for (size_t i = 0; i < ph1SorterR.size(); i++) {
    double dMyTheta = ph1SorterR[i].first;
    HighsInt index = ph1SorterR[i].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    dGradient -= fabs(col_aq.array[iRow]);
    // Stop when the gradient start to decrease
    if (dGradient <= 0) {
      break;
    }
    dMaxTheta = dMyTheta;
  }

  // Find out the biggest possible alpha for pivot
  pdqsort(ph1SorterT.begin(), ph1SorterT.end());
  double dMaxAlpha = 0.0;
  size_t iLast = ph1SorterT.size();
  for (size_t i = 0; i < ph1SorterT.size(); i++) {
    double dMyTheta = ph1SorterT[i].first;
    HighsInt index = ph1SorterT[i].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    double dAbsAlpha = fabs(col_aq.array[iRow]);
    // Stop when the theta is too large
    if (dMyTheta > dMaxTheta) {
      iLast = i;
      break;
    }
    // Update the maximal possible alpha
    if (dMaxAlpha < dAbsAlpha) {
      dMaxAlpha = dAbsAlpha;
    }
  }

  // Finally choose a pivot with good enough alpha, working backwards
  row_out = kNoRowChosen;
  variable_out = -1;
  move_out = 0;
  for (size_t i = iLast; i > 0; i--) {
    HighsInt index = ph1SorterT[i - 1].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    double dAbsAlpha = fabs(col_aq.array[iRow]);
    if (dAbsAlpha > dMaxAlpha * 0.1) {
      row_out = iRow;
      move_out = index >= 0 ? 1 : -1;
      break;
    }
  }
  analysis->simplexTimerStop(Chuzr2Clock);
}